

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VRNetServer.cpp
# Opt level: O0

void __thiscall MinVR::VRNetServer::~VRNetServer(VRNetServer *this)

{
  bool bVar1;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *__lhs;
  reference piVar2;
  VRNetInterface *in_RDI;
  iterator i;
  string str;
  vector<int,_std::allocator<int>_> *this_00;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *this_01;
  vector<int,_std::allocator<int>_> *this_02;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff30;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> in_stack_ffffffffffffff38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff40;
  string local_b8 [39];
  undefined1 local_91 [40];
  allocator<char> local_69;
  string local_68 [32];
  string local_48 [32];
  vector<int,_std::allocator<int>_> local_28;
  
  in_RDI->_vptr_VRNetInterface = (_func_int **)&PTR_syncEventDataAcrossAllNodes_001bc8c8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffff40,(char *)in_stack_ffffffffffffff38._M_current,
             (allocator<char> *)in_stack_ffffffffffffff30);
  this_02 = (vector<int,_std::allocator<int>_> *)local_91;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffff40,(char *)in_stack_ffffffffffffff38._M_current,
             (allocator<char> *)in_stack_ffffffffffffff30);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffff38._M_current,in_stack_ffffffffffffff30);
  this_01 = (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
            &stack0xffffffffffffff47;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffff40,(char *)in_stack_ffffffffffffff38._M_current,
             (allocator<char> *)in_stack_ffffffffffffff30);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffff38._M_current,in_stack_ffffffffffffff30);
  std::__cxx11::string::~string(local_b8);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff47);
  std::__cxx11::string::~string(local_48);
  std::__cxx11::string::~string((string *)(local_91 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_91);
  std::__cxx11::string::~string(local_68);
  std::allocator<char>::~allocator(&local_69);
  this_00 = &local_28;
  __lhs = (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
          std::__cxx11::string::c_str();
  std::__cxx11::string::size();
  std::ostream::write((char *)&std::cout,(long)__lhs);
  std::__cxx11::string::~string((string *)&local_28);
  std::vector<int,_std::allocator<int>_>::begin(this_00);
  while( true ) {
    std::vector<int,_std::allocator<int>_>::end(this_00);
    bVar1 = __gnu_cxx::operator<
                      (__lhs,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                             this_00);
    if (!bVar1) break;
    piVar2 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
                       ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                        &stack0xffffffffffffff38);
    close(*piVar2);
    __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
              (this_01,(int)((ulong)__lhs >> 0x20));
  }
  std::vector<int,_std::allocator<int>_>::~vector(this_02);
  VRNetInterface::~VRNetInterface(in_RDI);
  return;
}

Assistant:

VRNetServer::~VRNetServer()
{
  VRLOG_STATUS("VRNetServer closing all sockets.");
  for (std::vector<SOCKET>::iterator i=_clientSocketFDs.begin(); i < _clientSocketFDs.end(); i++) {
	#ifdef WIN32
      closesocket(*i);
    #else
      close(*i);
    #endif
  }

#ifdef WIN32
  WSACleanup();
#endif
}